

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O3

ControlledPollAction __thiscall
aeron::archive::ControlResponsePoller::onFragment
          (ControlResponsePoller *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  char *pcVar1;
  ushort uVar2;
  Value VVar3;
  SourcedException *this_00;
  char *pcVar4;
  char *pcVar5;
  uint64_t offset_00;
  MessageHeader hdr;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_80 [32];
  uint64_t local_60;
  ulong local_58;
  ulong local_50;
  MessageHeader local_48;
  
  local_48.m_buffer = (char *)0x0;
  local_48.m_offset = 0;
  offset_00 = (uint64_t)offset;
  io::aeron::archive::codecs::MessageHeader::wrap
            (&local_48,(char *)buffer->m_buffer,offset_00,0,(long)(int)buffer->m_length);
  uVar2 = *(ushort *)(local_48.m_buffer + local_48.m_offset + 2);
  if (uVar2 != 0x16) {
    if (uVar2 != 1) {
      this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_e0,(uint)uVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "unknown template id: ",&local_e0);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,
                 "ControlledPollAction aeron::archive::ControlResponsePoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                 ,"");
      pcVar5 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ControlResponsePoller.cpp"
      ;
      pcVar4 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar4 = pcVar4 + 1;
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar4 == *pcVar1);
      std::__cxx11::string::string((string *)&local_a0,pcVar5 + (*pcVar1 == '/'),&local_e1);
      aeron::util::SourcedException::SourcedException
                (this_00,(string *)local_80,&local_c0,&local_a0,0x55);
      *(undefined ***)this_00 = &PTR__SourcedException_00163260;
      __cxa_throw(this_00,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    local_80._0_8_ = buffer->m_buffer;
    local_80._24_8_ = offset_00 + 8;
    local_58 = (ulong)*(ushort *)(local_48.m_buffer + local_48.m_offset);
    local_50 = (ulong)*(ushort *)(local_48.m_buffer + local_48.m_offset + 6);
    local_80._8_8_ = SEXT48((int)buffer->m_length);
    local_80._16_8_ = &local_60;
    io::aeron::archive::codecs::ControlResponse::sbePosition
              ((ControlResponse *)local_80,offset_00 + local_58 + 8);
    this->controlSessionId_ = *(int64_t *)(local_80._0_8_ + local_80._24_8_);
    this->correlationId_ = *(int64_t *)(local_80._0_8_ + local_80._24_8_ + 8);
    this->relevantId_ = *(int64_t *)(local_80._0_8_ + local_80._24_8_ + 0x10);
    this->templateId_ = 1;
    VVar3 = io::aeron::archive::codecs::ControlResponseCode::get
                      (*(int32_t *)(local_80._0_8_ + local_80._24_8_ + 0x18));
    this->code_ = VVar3;
    if (VVar3 == ERROR) {
      io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
                (&local_e0,(ControlResponse *)local_80);
      std::__cxx11::string::_M_assign((string *)&this->errorMessage_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&this->errorMessage_,0,(char *)(this->errorMessage_)._M_string_length,
                 0x14d195);
    }
  }
  this->isPollComplete_ = true;
  return BREAK;
}

Assistant:

ControlledPollAction ControlResponsePoller::onFragment(concurrent::AtomicBuffer& buffer, util::index_t offset,
                                                       util::index_t length, Header& header) {
    codecs::MessageHeader hdr;
    hdr.wrap((char*)buffer.buffer(), offset, 0, buffer.capacity());

    const std::uint16_t templateId = hdr.templateId();

    if (templateId == codecs::ControlResponse::sbeTemplateId()) {
        codecs::ControlResponse msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        controlSessionId_ = msg.controlSessionId();
        correlationId_ = msg.correlationId();
        relevantId_ = msg.relevantId();
        templateId_ = templateId;
        code_ = msg.code();

        if (code_ == codecs::ControlResponseCode::ERROR) {
            errorMessage_ = msg.getErrorMessageAsString();
        } else {
            errorMessage_ = "";
        }
    } else if (templateId != codecs::RecordingDescriptor::sbeTemplateId()) {
        throw ArchiveException("unknown template id: " + std::to_string(templateId), SOURCEINFO);
    }

    isPollComplete_ = true;

    return ControlledPollAction::BREAK;
}